

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O0

void board::Board::INIT(void)

{
  int iVar1;
  result_type_conflict rVar2;
  unsigned_long __a;
  unsigned_long __b;
  result_type rVar3;
  unsigned_long *__first;
  unsigned_long *__last;
  byte bVar4;
  __type_conflict _Var5;
  int local_1dd8;
  int local_1dd4;
  int file;
  int rank;
  int i_2;
  int i_1;
  int tSquare;
  int square;
  result_type *local_1db8;
  uint64_t *j;
  uint64_t *__end2;
  uint64_t *__begin2;
  uint64_t (*__range2) [120];
  uint64_t (*i) [120];
  uint64_t (*__end1) [120];
  uint64_t (*__begin1) [120];
  uint64_t (*__range1) [13] [120];
  uniform_int_distribution<unsigned_long> dist;
  undefined1 local_1d58 [8];
  mt19937_64 e2;
  random_device rd;
  
  std::random_device::random_device((random_device *)&e2._M_p);
  rVar2 = std::random_device::operator()((random_device *)&e2._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)local_1d58,(ulong)rVar2);
  _Var5 = std::pow<int,int>(2,0x3d);
  __a = llround(_Var5);
  _Var5 = std::pow<int,int>(2,0x3e);
  __b = llround(_Var5);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&__range1,__a,__b);
  __begin1 = PIECE_KEYS;
  i = (uint64_t (*) [120])CASTLE_KEYS;
  for (__end1 = PIECE_KEYS; __end1 != i; __end1 = __end1 + 1) {
    __range2 = __end1;
    __begin2 = *__end1;
    j = __end1[1];
    for (__end2 = *__end1; __end2 != j; __end2 = __end2 + 1) {
      local_1db8 = __end2;
      rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)&__range1,
                         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)local_1d58);
      *local_1db8 = rVar3;
    }
  }
  __first = std::begin<unsigned_long,16ul>((unsigned_long (*) [16])CASTLE_KEYS);
  __last = std::end<unsigned_long,16ul>((unsigned_long (*) [16])CASTLE_KEYS);
  _tSquare = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)&__range1,
                        (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                         *)local_1d58);
  std::fill<unsigned_long*,unsigned_long>(__first,__last,(unsigned_long *)&tSquare);
  SIDE_KEY = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)&__range1,
                        (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                         *)local_1d58);
  for (rank = 0; rank < 8; rank = rank + 1) {
    FILE_MASK[rank] = 0;
    RANK_MASK[rank] = 0;
  }
  for (file = 0; file < 0x40; file = file + 1) {
    PASSED_PAWN_MASK[0][file] = 0;
    PASSED_PAWN_MASK[1][file] = 0;
    ISOLATED_PAWN_MASK[file] = 0;
  }
  for (local_1dd4 = 0; local_1dd4 < 8; local_1dd4 = local_1dd4 + 1) {
    for (local_1dd8 = 0; local_1dd8 < 8; local_1dd8 = local_1dd8 + 1) {
      bVar4 = (char)local_1dd4 * '\b' + (char)local_1dd8;
      FILE_MASK[local_1dd8] = 1L << (bVar4 & 0x3f) | FILE_MASK[local_1dd8];
      RANK_MASK[local_1dd4] = 1L << (bVar4 & 0x3f) | RANK_MASK[local_1dd4];
    }
  }
  for (i_1 = 0; i_2 = i_1, i_1 < 0x40; i_1 = i_1 + 1) {
    while (i_2 = i_2 + 8, iVar1 = i_1, i_2 < 0x40) {
      PASSED_PAWN_MASK[0][i_1] = 1L << ((byte)i_2 & 0x3f) | PASSED_PAWN_MASK[0][i_1];
    }
    while (i_2 = iVar1 + -8, -1 < i_2) {
      PASSED_PAWN_MASK[1][i_1] = 1L << ((byte)i_2 & 0x3f) | PASSED_PAWN_MASK[1][i_1];
      iVar1 = i_2;
    }
    if (0 < FILES[i_1]) {
      ISOLATED_PAWN_MASK[i_1] = FILE_MASK[FILES[i_1] + -1] | ISOLATED_PAWN_MASK[i_1];
      for (i_2 = i_1 + 7; i_2 < 0x40; i_2 = i_2 + 8) {
        PASSED_PAWN_MASK[0][i_1] = 1L << ((byte)i_2 & 0x3f) | PASSED_PAWN_MASK[0][i_1];
      }
      for (i_2 = i_1 + -9; -1 < i_2; i_2 = i_2 + -8) {
        PASSED_PAWN_MASK[1][i_1] = 1L << ((byte)i_2 & 0x3f) | PASSED_PAWN_MASK[1][i_1];
      }
    }
    if (FILES[i_1] < 7) {
      ISOLATED_PAWN_MASK[i_1] = FILE_MASK[FILES[i_1] + 1] | ISOLATED_PAWN_MASK[i_1];
      for (i_2 = i_1 + 9; i_2 < 0x40; i_2 = i_2 + 8) {
        PASSED_PAWN_MASK[0][i_1] = 1L << ((byte)i_2 & 0x3f) | PASSED_PAWN_MASK[0][i_1];
      }
      for (i_2 = i_1 + -9; -1 < i_2; i_2 = i_2 + -8) {
        PASSED_PAWN_MASK[1][i_1] = 1L << ((byte)i_2 & 0x3f) | PASSED_PAWN_MASK[1][i_1];
      }
    }
  }
  std::random_device::~random_device((random_device *)&e2._M_p);
  return;
}

Assistant:

void board::Board::INIT()
{
    // Zobrist hash keys
    std::random_device rd;
    std::mt19937_64 e2(rd());
    std::uniform_int_distribution<uint64_t> dist(std::llround(std::pow(2, 61)), std::llround(std::pow(2, 62)));
    for (auto& i : PIECE_KEYS) {
        for (auto& j : i) {
            j = dist(e2);
        }
    }
    std::fill(std::begin(CASTLE_KEYS), std::end(CASTLE_KEYS), dist(e2));
    SIDE_KEY = dist(e2);
    // Bitmasks
    int square;
    int tSquare;
    for (int i = 0; i < 8; i++) {
        FILE_MASK[i] = 0ULL;
        RANK_MASK[i] = 0ULL;
    }
    for (int i = 0; i < 64; i++) {
        PASSED_PAWN_MASK[0][i] = 0ULL;
        PASSED_PAWN_MASK[1][i] = 0ULL;
        ISOLATED_PAWN_MASK[i] = 0ULL;
    }
    for (int rank = RANK_1; rank <= RANK_8; rank++) {
        for (int file = FILE_A; file <= FILE_H; file++) {
            square = rank * 8 + file;
            FILE_MASK[file] |= (1ULL << square);
            RANK_MASK[rank] |= (1ULL << square);
        }
    }
    for (square = 0; square < 64; square++) {
        tSquare = square + 8;
        while (tSquare < 64) {
            PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
            tSquare += 8;
        }
        tSquare = square - 8;
        while (tSquare >= 0) {
            PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
            tSquare -= 8;
        }
        if (Board::FILES[square] > FILE_A) {
            ISOLATED_PAWN_MASK[square] |= FILE_MASK[Board::FILES[square] - 1];
            tSquare = square + 7;
            while (tSquare < 64) {
                PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
                tSquare += 8;
            }
            tSquare = square - 9;
            while (tSquare >= 0) {
                PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
                tSquare -= 8;
            }
        }
        if (Board::FILES[square] < FILE_H) {
            ISOLATED_PAWN_MASK[square] |= FILE_MASK[Board::FILES[square] + 1];
            tSquare = square + 9;
            while (tSquare < 64) {
                PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
                tSquare += 8;
            }
            tSquare = square - 9;
            while (tSquare >= 0) {
                PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
                tSquare -= 8;
            }
        }
    }
}